

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int selectColumnsFromExprList(Parse *pParse,ExprList *pEList,i16 *pnCol,Column **paCol)

{
  u8 uVar1;
  sqlite3 *db;
  ExprList_item *pEVar2;
  Table *pTVar3;
  uint uVar4;
  ushort uVar5;
  uint uVar6;
  int iVar7;
  Column *p;
  Column *pCVar8;
  Expr *pEVar9;
  char *pcVar10;
  char *pcVar11;
  Column *extraout_RAX;
  byte *pbVar12;
  uint uVar13;
  byte bVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  
  db = pParse->db;
  if (pEList == (ExprList *)0x0) {
    p = (Column *)0x0;
    uVar6 = 0;
  }
  else {
    uVar6 = pEList->nExpr;
    p = (Column *)sqlite3DbMallocZero(db,uVar6 * 0x30);
  }
  *pnCol = (i16)uVar6;
  *paCol = p;
  if ((int)uVar6 < 1) {
    uVar6 = 0;
  }
  uVar17 = (ulong)uVar6;
  uVar19 = 0;
  pCVar8 = p;
  do {
    if (uVar19 == uVar17) {
LAB_00170452:
      if (db->mallocFailed != '\0') {
        for (lVar18 = 0; uVar17 * 0x30 - lVar18 != 0; lVar18 = lVar18 + 0x30) {
          sqlite3DbFree(db,*(void **)((long)&p->zName + lVar18));
        }
        sqlite3DbFree(db,p);
        *paCol = (Column *)0x0;
        *pnCol = 0;
        pCVar8 = (Column *)paCol;
      }
      return (int)pCVar8;
    }
    pEVar2 = pEList->a;
    pEVar9 = sqlite3ExprSkipCollate(pEVar2[uVar19].pExpr);
    if (pEVar2[uVar19].zName == (char *)0x0) {
      for (; uVar1 = pEVar9->op, uVar1 == 'v'; pEVar9 = pEVar9->pRight) {
      }
      if (uVar1 == '\x1a') {
        pcVar10 = (pEVar9->u).zToken;
      }
      else if ((uVar1 == 0x98) && (pTVar3 = pEVar9->pTab, pTVar3 != (Table *)0x0)) {
        uVar5 = pEVar9->iColumn;
        if ((short)uVar5 < 0) {
          uVar5 = pTVar3->iPKey;
          pcVar10 = "rowid";
          if ((short)uVar5 < 0) goto LAB_00170344;
        }
        pcVar10 = pTVar3->aCol[uVar5].zName;
      }
      else {
        pcVar10 = pEVar2[uVar19].zSpan;
      }
LAB_00170344:
      pcVar10 = sqlite3MPrintf(db,"%s",pcVar10);
    }
    else {
      pcVar10 = sqlite3DbStrDup(db,pEVar2[uVar19].zName);
    }
    if (db->mallocFailed != '\0') {
      sqlite3DbFree(db,pcVar10);
      uVar17 = uVar19 & 0xffffffff;
      pCVar8 = extraout_RAX;
      goto LAB_00170452;
    }
    uVar6 = sqlite3Strlen30(pcVar10);
    uVar16 = 0;
    for (iVar15 = 0; (long)iVar15 < (long)uVar19; iVar15 = iVar15 + 1) {
      iVar7 = sqlite3_stricmp(p[iVar15].zName,pcVar10);
      pcVar11 = pcVar10;
      if (iVar7 == 0) {
        pbVar12 = (byte *)(pcVar10 + (int)(uVar6 - 1));
        uVar4 = uVar6;
        do {
          uVar13 = uVar4;
          if ((int)uVar13 < 3) {
            bVar14 = *pbVar12;
            break;
          }
          bVar14 = pcVar10[uVar13 - 1];
          pbVar12 = pbVar12 + -1;
          uVar4 = uVar13 - 1;
        } while (0xfffffffffffffff5 < (ulong)bVar14 - 0x3a);
        if (bVar14 == 0x3a) {
          uVar6 = uVar13 - 1;
        }
        pcVar10[(int)uVar6] = '\0';
        uVar16 = uVar16 + 1;
        pcVar11 = sqlite3MPrintf(db,"%s:%d",pcVar10,(ulong)uVar16);
        sqlite3DbFree(db,pcVar10);
        iVar15 = -1;
        if (pcVar11 == (char *)0x0) {
          pcVar10 = (char *)0x0;
          break;
        }
      }
      pcVar10 = pcVar11;
    }
    pCVar8->zName = pcVar10;
    uVar19 = uVar19 + 1;
    pCVar8 = pCVar8 + 1;
  } while( true );
}

Assistant:

static int selectColumnsFromExprList(
  Parse *pParse,          /* Parsing context */
  ExprList *pEList,       /* Expr list from which to derive column names */
  i16 *pnCol,             /* Write the number of columns here */
  Column **paCol          /* Write the new column list here */
){
  sqlite3 *db = pParse->db;   /* Database connection */
  int i, j;                   /* Loop counters */
  int cnt;                    /* Index added to make the name unique */
  Column *aCol, *pCol;        /* For looping over result columns */
  int nCol;                   /* Number of columns in the result set */
  Expr *p;                    /* Expression for a single result column */
  char *zName;                /* Column name */
  int nName;                  /* Size of name in zName[] */

  if( pEList ){
    nCol = pEList->nExpr;
    aCol = sqlite3DbMallocZero(db, sizeof(aCol[0])*nCol);
    testcase( aCol==0 );
  }else{
    nCol = 0;
    aCol = 0;
  }
  *pnCol = nCol;
  *paCol = aCol;

  for(i=0, pCol=aCol; i<nCol; i++, pCol++){
    /* Get an appropriate name for the column
    */
    p = sqlite3ExprSkipCollate(pEList->a[i].pExpr);
    if( (zName = pEList->a[i].zName)!=0 ){
      /* If the column contains an "AS <name>" phrase, use <name> as the name */
      zName = sqlite3DbStrDup(db, zName);
    }else{
      Expr *pColExpr = p;  /* The expression that is the result column name */
      Table *pTab;         /* Table associated with this expression */
      while( pColExpr->op==TK_DOT ){
        pColExpr = pColExpr->pRight;
        assert( pColExpr!=0 );
      }
      if( pColExpr->op==TK_COLUMN && ALWAYS(pColExpr->pTab!=0) ){
        /* For columns use the column name name */
        int iCol = pColExpr->iColumn;
        pTab = pColExpr->pTab;
        if( iCol<0 ) iCol = pTab->iPKey;
        zName = sqlite3MPrintf(db, "%s",
                 iCol>=0 ? pTab->aCol[iCol].zName : "rowid");
      }else if( pColExpr->op==TK_ID ){
        assert( !ExprHasProperty(pColExpr, EP_IntValue) );
        zName = sqlite3MPrintf(db, "%s", pColExpr->u.zToken);
      }else{
        /* Use the original text of the column expression as its name */
        zName = sqlite3MPrintf(db, "%s", pEList->a[i].zSpan);
      }
    }
    if( db->mallocFailed ){
      sqlite3DbFree(db, zName);
      break;
    }

    /* Make sure the column name is unique.  If the name is not unique,
    ** append a integer to the name so that it becomes unique.
    */
    nName = sqlite3Strlen30(zName);
    for(j=cnt=0; j<i; j++){
      if( sqlite3StrICmp(aCol[j].zName, zName)==0 ){
        char *zNewName;
        int k;
        for(k=nName-1; k>1 && sqlite3Isdigit(zName[k]); k--){}
        if( zName[k]==':' ) nName = k;
        zName[nName] = 0;
        zNewName = sqlite3MPrintf(db, "%s:%d", zName, ++cnt);
        sqlite3DbFree(db, zName);
        zName = zNewName;
        j = -1;
        if( zName==0 ) break;
      }
    }
    pCol->zName = zName;
  }
  if( db->mallocFailed ){
    for(j=0; j<i; j++){
      sqlite3DbFree(db, aCol[j].zName);
    }
    sqlite3DbFree(db, aCol);
    *paCol = 0;
    *pnCol = 0;
    return SQLITE_NOMEM;
  }
  return SQLITE_OK;
}